

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeCursor(Btree *p,int iTable,int wrFlag,KeyInfo *pKeyInfo,BtCursor *pCur)

{
  int *piVar1;
  BtShared *pBVar2;
  BtCursor *pBVar3;
  BtCursor *pBVar4;
  u8 *puVar5;
  int iVar6;
  
  if (iTable < 1) {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10854,
                "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
    return 0xb;
  }
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  pBVar2 = p->pBt;
  if ((wrFlag != 0) && (pBVar2->pTmpSpace == (u8 *)0x0)) {
    puVar5 = (u8 *)pcache1Alloc(pBVar2->pageSize);
    pBVar2->pTmpSpace = puVar5;
    if (puVar5 == (u8 *)0x0) {
      iVar6 = 7;
      goto LAB_001735b9;
    }
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\0';
    puVar5[6] = '\0';
    puVar5[7] = '\0';
    pBVar2->pTmpSpace = pBVar2->pTmpSpace + 4;
  }
  if (iTable == 1) {
    iTable = (int)(pBVar2->nPage != 0);
  }
  pCur->pgnoRoot = iTable;
  pCur->iPage = -1;
  pCur->pKeyInfo = pKeyInfo;
  pCur->pBtree = p;
  pCur->pBt = pBVar2;
  pCur->curFlags = wrFlag != 0;
  pCur->curPagerFlags = (wrFlag == 0) * '\x02';
  pBVar3 = pBVar2->pCursor;
  for (pBVar4 = pBVar3; pBVar4 != (BtCursor *)0x0; pBVar4 = pBVar4->pNext) {
    if (pBVar4->pgnoRoot == iTable) {
      pBVar4->curFlags = pBVar4->curFlags | 0x20;
      pCur->curFlags = pCur->curFlags | 0x20;
    }
  }
  pCur->pNext = pBVar3;
  pBVar2->pCursor = pCur;
  pCur->eState = '\x01';
  iVar6 = 0;
LAB_001735b9:
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCursor(
  Btree *p,                                   /* The btree */
  int iTable,                                 /* Root page of table to open */
  int wrFlag,                                 /* 1 to write. 0 read-only */
  struct KeyInfo *pKeyInfo,                   /* First arg to xCompare() */
  BtCursor *pCur                              /* Write new cursor here */
){
  int rc;
  if( iTable<1 ){
    rc = SQLITE_CORRUPT_BKPT;
  }else{
    sqlite3BtreeEnter(p);
    rc = btreeCursor(p, iTable, wrFlag, pKeyInfo, pCur);
    sqlite3BtreeLeave(p);
  }
  return rc;
}